

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O0

void glob_addtopath(t_pd *dummy,t_symbol *path,t_float saveit)

{
  t_symbol *ptVar1;
  t_namelist *ptVar2;
  t_symbol *s;
  int saveflag;
  t_float saveit_local;
  t_symbol *path_local;
  t_pd *dummy_local;
  
  ptVar1 = sys_decodedialog(path);
  if (*ptVar1->s_name != '\0') {
    if ((int)saveit < 0) {
      ptVar2 = namelist_append_files((pd_maininstance.pd_stuff)->st_temppath,ptVar1->s_name);
      (pd_maininstance.pd_stuff)->st_temppath = ptVar2;
    }
    else {
      ptVar2 = namelist_append_files((pd_maininstance.pd_stuff)->st_searchpath,ptVar1->s_name);
      (pd_maininstance.pd_stuff)->st_searchpath = ptVar2;
    }
    if (0.0 < saveit) {
      sys_savepreferences((char *)0x0);
    }
  }
  return;
}

Assistant:

void glob_addtopath(t_pd *dummy, t_symbol *path, t_float saveit)
{
    int saveflag = (int)saveit;
    t_symbol *s = sys_decodedialog(path);
    if (*s->s_name)
    {
        if (saveflag < 0)
            STUFF->st_temppath =
                namelist_append_files(STUFF->st_temppath, s->s_name);
        else
            STUFF->st_searchpath =
                namelist_append_files(STUFF->st_searchpath, s->s_name);
        if (saveit > 0)
            sys_savepreferences(0);
    }
}